

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall helics::Filter::Filter(Filter *this,Core *core,string_view filtName)

{
  int iVar1;
  undefined8 in_R9;
  
  Interface::Interface(&this->super_Interface,core,(InterfaceHandle)0x9aac0f00,filtName);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Filter_00455858;
  this->cloning = false;
  this->disableAssign = false;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar1 = (*core->_vptr_Core[0x3b])(core,filtName._M_len,filtName._M_str,0,0,in_R9,0,0);
  (this->super_Interface).handle.hid = iVar1;
  return;
}

Assistant:

Filter::Filter(Core* core, std::string_view filtName): Interface(core, InterfaceHandle(), filtName)
{
    handle = core->registerFilter(filtName, std::string_view{}, std::string_view{});
}